

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  FilePath *in_RDI;
  FilePath result;
  long *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  long *local_80;
  long local_78;
  long local_70;
  undefined8 uStack_68;
  FilePath local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  paVar1 = &local_60.pathname_.field_2;
  local_60.pathname_._M_string_length = 0;
  local_60.pathname_.field_2._M_local_buf[0] = '\0';
  local_60.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pcVar2 = ((local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_a0 = (long *)&local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,
             pcVar2 + (local_40.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  lVar3 = local_98;
  if (local_a0 == (long *)&local_90) {
    uStack_68 = uStack_88;
    local_a0 = &local_70;
  }
  local_70 = CONCAT71(uStack_8f,local_90);
  local_98 = 0;
  local_90 = 0;
  plVar4 = local_a0;
  plVar5 = local_a0;
  if (lVar3 != 0) {
    do {
      if ((plVar4 == local_a0 || (char)*plVar5 != '/') || (*(char *)((long)plVar4 + -1) != '/')) {
        *(char *)plVar4 = (char)*plVar5;
        plVar4 = (long *)((long)plVar4 + 1);
      }
      plVar5 = (long *)((long)plVar5 + 1);
    } while (plVar5 != (long *)((long)local_a0 + lVar3));
  }
  local_78 = (long)plVar4 - (long)local_a0;
  *(char *)plVar4 = '\0';
  local_80 = local_a0;
  local_a0 = (long *)&local_90;
  std::__cxx11::string::_M_assign((string *)&local_60);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != (long *)&local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  FilePath::RemoveDirectoryName(in_RDI,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.pathname_._M_dataplus._M_p,
                    CONCAT71(local_60.pathname_.field_2._M_allocated_capacity._1_7_,
                             local_60.pathname_.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_OS2)
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}